

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3ExprParse
              (sqlite3_tokenizer *pTokenizer,int iLangid,char **azCol,int bFts4,int nCol,
              int iDefaultCol,char *z,int n,Fts3Expr **ppExpr,char **pzErr)

{
  int local_30;
  int rc;
  int iDefaultCol_local;
  int nCol_local;
  int bFts4_local;
  char **azCol_local;
  int iLangid_local;
  sqlite3_tokenizer *pTokenizer_local;
  
  local_30 = fts3ExprParseUnbalanced(pTokenizer,iLangid,azCol,bFts4,nCol,iDefaultCol,z,n,ppExpr);
  if (((local_30 == 0) && (*ppExpr != (Fts3Expr *)0x0)) &&
     (local_30 = fts3ExprBalance(ppExpr,0xc), local_30 == 0)) {
    local_30 = fts3ExprCheckDepth(*ppExpr,0xc);
  }
  if (local_30 != 0) {
    sqlite3Fts3ExprFree(*ppExpr);
    *ppExpr = (Fts3Expr *)0x0;
    if (local_30 == 0x12) {
      sqlite3Fts3ErrMsg(pzErr,"FTS expression tree is too large (maximum depth %d)",0xc);
      local_30 = 1;
    }
    else if (local_30 == 1) {
      sqlite3Fts3ErrMsg(pzErr,"malformed MATCH expression: [%s]",z);
    }
  }
  return local_30;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3ExprParse(
  sqlite3_tokenizer *pTokenizer,      /* Tokenizer module */
  int iLangid,                        /* Language id for tokenizer */
  char **azCol,                       /* Array of column names for fts3 table */
  int bFts4,                          /* True to allow FTS4-only syntax */
  int nCol,                           /* Number of entries in azCol[] */
  int iDefaultCol,                    /* Default column to query */
  const char *z, int n,               /* Text of MATCH query */
  Fts3Expr **ppExpr,                  /* OUT: Parsed query structure */
  char **pzErr                        /* OUT: Error message (sqlite3_malloc) */
){
  int rc = fts3ExprParseUnbalanced(
      pTokenizer, iLangid, azCol, bFts4, nCol, iDefaultCol, z, n, ppExpr
  );
  
  /* Rebalance the expression. And check that its depth does not exceed
  ** SQLITE_FTS3_MAX_EXPR_DEPTH.  */
  if( rc==SQLITE_OK && *ppExpr ){
    rc = fts3ExprBalance(ppExpr, SQLITE_FTS3_MAX_EXPR_DEPTH);
    if( rc==SQLITE_OK ){
      rc = fts3ExprCheckDepth(*ppExpr, SQLITE_FTS3_MAX_EXPR_DEPTH);
    }
  }

  if( rc!=SQLITE_OK ){
    sqlite3Fts3ExprFree(*ppExpr);
    *ppExpr = 0;
    if( rc==SQLITE_TOOBIG ){
      sqlite3Fts3ErrMsg(pzErr,
          "FTS expression tree is too large (maximum depth %d)", 
          SQLITE_FTS3_MAX_EXPR_DEPTH
      );
      rc = SQLITE_ERROR;
    }else if( rc==SQLITE_ERROR ){
      sqlite3Fts3ErrMsg(pzErr, "malformed MATCH expression: [%s]", z);
    }
  }

  return rc;
}